

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O2

int rops_issue_keepalive_ws(lws *wsi,int isvalid)

{
  undefined1 *puVar1;
  int iVar2;
  lws *plVar3;
  lws_usec_t lVar4;
  
  if ((wsi->wsistate & 0xf000000) == 0x1000000) {
    plVar3 = rops_encapsulation_parent_h2(wsi);
    if (plVar3 == (lws *)0x0) {
      __assert_fail("enc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/ws/ops-ws.c"
                    ,0x7e4,"int rops_issue_keepalive_ws(struct lws *, int)");
    }
    iVar2 = (*plVar3->role_ops->issue_keepalive)(plVar3,isvalid);
    if (iVar2 != 0) {
      return 1;
    }
  }
  if (isvalid == 0) {
    lVar4 = lws_now_usecs();
    *(lws_usec_t *)(wsi->ws->ping_payload_buf + 0x10) = lVar4;
    puVar1 = &wsi->ws->field_0x95;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x2000;
    lws_callback_on_writable(wsi);
  }
  else {
    _lws_validity_confirmed_role(wsi);
  }
  return 0;
}

Assistant:

static int
rops_issue_keepalive_ws(struct lws *wsi, int isvalid)
{
	uint64_t us;

#if defined(LWS_WITH_HTTP2)
	if (lwsi_role_h2_ENCAPSULATION(wsi)) {
		/* we know then that it has an h2 parent */
		struct lws *enc = role_ops_h2.encapsulation_parent(wsi);

		assert(enc);
		if (enc->role_ops->issue_keepalive(enc, isvalid))
			return 1;
	}
#endif

	if (isvalid)
		_lws_validity_confirmed_role(wsi);
	else {
		us = lws_now_usecs();
		memcpy(&wsi->ws->ping_payload_buf[LWS_PRE], &us, 8);
		wsi->ws->send_check_ping = 1;
		lws_callback_on_writable(wsi);
	}

	return 0;
}